

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *pppFVar1;
  uint *puVar2;
  pointer *ppWVar3;
  byte bVar4;
  undefined8 *puVar5;
  pointer ppFVar6;
  uint uVar7;
  undefined8 uVar8;
  int iVar9;
  __pid_t _Var10;
  __pid_t _Var11;
  Module *pMVar12;
  FunctionType *pFVar13;
  IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *pIVar14;
  LoadInst *a;
  ulong uVar15;
  Value *pVVar16;
  Type *pTVar17;
  BasicBlock *pBVar18;
  ulong uVar19;
  Function *pFVar20;
  Twine *pTVar21;
  ValueHandleBase *this;
  Pass *pPVar22;
  ostream *poVar23;
  long *plVar24;
  raw_ostream *prVar25;
  undefined8 *puVar26;
  uint uVar27;
  undefined8 uVar28;
  pointer ppFVar29;
  long *plVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  uint uVar32;
  pointer ppTVar33;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_00;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_01;
  int i;
  uint uVar34;
  long lVar35;
  Function *pFVar36;
  Function *pFVar37;
  undefined1 auVar38 [8];
  IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *this_00;
  char *pcVar39;
  Argument *A;
  Function *pFVar40;
  BranchInst **bi;
  long lVar41;
  uint __len;
  Module *pMVar42;
  bool bVar43;
  bool bVar44;
  StringRef T;
  StringRef SVar45;
  StringRef Str;
  StringRef Str_00;
  iterator_range<llvm::Argument_*> iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [12];
  uint in_stack_fffffffffffffcdc;
  undefined1 in_stack_fffffffffffffce0;
  PrettyStackTraceProgram local_318 [8];
  PrettyStackTraceProgram X;
  undefined1 local_2f8 [8];
  ValueToValueMapTy VMap;
  ios_base local_278 [264];
  undefined1 local_170 [8];
  string SStr;
  undefined1 auStack_148 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> ArgsTy;
  long *local_108;
  undefined1 auStack_f8 [8];
  vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> InstToDelete;
  int local_d0;
  int local_cc;
  int p [2];
  PassManager Passes;
  undefined1 auStack_b8 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> RealArgsTy;
  pointer *pppFStack_78;
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> Funcs;
  undefined1 local_50 [8];
  int Budget;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram(local_318,argc,argv);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)"llvm codegen stress-tester\n",
             (StringRef)ZEXT816(0x1b),(raw_ostream *)0x0,
             (char *)((ulong)in_stack_fffffffffffffcdc << 0x20),(bool)in_stack_fffffffffffffce0);
  if (1 < (int)(anonymous_namespace)::W._128_4_) {
    (anonymous_namespace)::Shmem = (undefined8 *)mmap((void *)0x0,0x1498,3,0x21,-1,0);
    if ((anonymous_namespace)::Shmem == (undefined8 *)0xffffffffffffffff) {
      pcVar39 = "mmap failed";
      goto LAB_0026000f;
    }
    LOCK();
    *(anonymous_namespace)::Shmem = 1;
    puVar26 = (anonymous_namespace)::Shmem;
    UNLOCK();
    *(undefined4 *)((long)(anonymous_namespace)::Shmem + 0x148c) = 1;
    iVar9 = pthread_mutexattr_init((pthread_mutexattr_t *)(puVar26 + 6));
    if (iVar9 != 0) {
      pcVar39 = "pthread_mutexattr_init failed";
      goto LAB_0026000f;
    }
    iVar9 = pthread_mutexattr_setpshared
                      ((pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6),1);
    if (iVar9 != 0) {
      pcVar39 = "pthread_mutexattr_setpshared failed";
      goto LAB_0026000f;
    }
    iVar9 = pthread_mutex_init((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1),
                               (pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6));
    if (iVar9 != 0) {
      pcVar39 = "pthread_mutex_init failed";
      goto LAB_0026000f;
    }
    iVar9 = pthread_condattr_init((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
    if (iVar9 != 0) {
      pcVar39 = "pthread_condattr_init failed";
      goto LAB_0026000f;
    }
    iVar9 = pthread_condattr_setpshared
                      ((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291),1);
    if (iVar9 != 0) {
      pcVar39 = "pthread_condattr_setpshared failed";
      goto LAB_0026000f;
    }
    lVar35 = 0x38;
    lVar41 = 0;
    do {
      iVar9 = pthread_cond_init((pthread_cond_t *)((long)(anonymous_namespace)::Shmem + lVar35),
                                (pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
      if (iVar9 != 0) {
        anon_unknown.dwarf_23d32::die("pthread_cond_init failed");
      }
      *(undefined4 *)((long)(anonymous_namespace)::Shmem + lVar41 * 4 + 0x12f8) = 0;
      lVar41 = lVar41 + 1;
      lVar35 = lVar35 + 0x30;
    } while (lVar41 != 100);
    (anonymous_namespace)::Init = 1;
    _Var10 = getpid();
    iVar9 = atexit(anon_unknown.dwarf_23d32::decrease_runners);
    if (iVar9 != 0) {
      pcVar39 = "atexit failed";
LAB_00260024:
      anon_unknown.dwarf_23d32::die(pcVar39);
    }
    iVar9 = pipe(&local_d0);
    if (iVar9 != 0) {
      pcVar39 = "pipe failed??";
      goto LAB_00260024;
    }
    pMVar12 = (Module *)operator_new(800);
    llvm::Module::Module
              (pMVar12,(StringRef)ZEXT816(0x8146ba),(LLVMContext *)&(anonymous_namespace)::C);
    (anonymous_namespace)::M = pMVar12;
    if ((anonymous_namespace)::ARM64[0x80] == '\x01') {
      T.Length = 0x19;
      T.Data = "aarch64-unknown-linux-gnu";
      llvm::Module::setTargetTriple(pMVar12,T);
      SVar45.Length = 0x33;
      SVar45.Data = "e-m:e-i8:8:32-i16:16:32-i64:64-i128:128-n32:64-S128";
      llvm::Module::setDataLayout((anonymous_namespace)::M,SVar45);
    }
    auStack_148 = (undefined1  [8])0x0;
    ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (-2 < (int)(anonymous_namespace)::N._128_4_) {
      iVar9 = -1;
      do {
        anon_unknown.dwarf_23d32::makeArg
                  ((anonymous_namespace)::W._128_4_,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_148,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_b8);
        anon_unknown.dwarf_23d32::makeArg
                  ((anonymous_namespace)::W._128_4_,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_148,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_b8);
        anon_unknown.dwarf_23d32::makeArg
                  (1,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_148,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_b8);
        anon_unknown.dwarf_23d32::makeArg
                  ((int)(anonymous_namespace)::W._128_4_ / 2,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_148,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_b8);
        anon_unknown.dwarf_23d32::makeArg
                  ((anonymous_namespace)::W._128_4_ * 2,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_148,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_b8);
        iVar9 = iVar9 + 1;
      } while (iVar9 <= (int)(anonymous_namespace)::N._128_4_);
    }
    uVar34 = 1;
    if ((anonymous_namespace)::Geni1[0x80] == '\0') {
      uVar34 = (anonymous_namespace)::W._128_4_;
    }
    uVar32 = uVar34;
    if ((int)uVar34 < (int)(anonymous_namespace)::Promote._128_4_) {
      uVar32 = (anonymous_namespace)::Promote._128_4_;
    }
    if ((anonymous_namespace)::Promote._128_4_ == -1) {
      uVar32 = uVar34;
    }
    pFVar13 = (FunctionType *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar32)
    ;
    ppTVar33 = RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    auVar38 = auStack_b8;
    if ((anonymous_namespace)::ArgsFromMem[0x80] != '\0') {
      ppTVar33 = (pointer)0x0;
      auVar38 = (undefined1  [8])(Twine *)0x0;
    }
    pFVar13 = (FunctionType *)
              llvm::FunctionType::get(pFVar13,auVar38,(long)ppTVar33 - (long)auVar38 >> 3,0);
    llvm::Twine::Twine((Twine *)local_2f8,
                       (string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
    (anonymous_namespace)::F =
         llvm::Function::Create(pFVar13,ExternalLinkage,(Twine *)local_2f8,(anonymous_namespace)::M)
    ;
    llvm::Twine::Twine((Twine *)local_2f8,"");
    local_50 = (undefined1  [8])
               llvm::BasicBlock::Create
                         ((LLVMContext *)&(anonymous_namespace)::C,(Twine *)local_2f8,
                          (anonymous_namespace)::F,(BasicBlock *)0x0);
    std::vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>>::
    emplace_back<llvm::BasicBlock*>
              ((vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>> *)
               &(anonymous_namespace)::BBs,(BasicBlock **)local_50);
    pIVar14 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)operator_new(0x88);
    llvm::IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
              (pIVar14,(BasicBlock *)*(anonymous_namespace)::BBs,(MDNode *)0x0,
               (ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>)ZEXT816(0));
    local_50._0_4_ = (anonymous_namespace)::N._128_4_;
    pBVar18 = (BasicBlock *)*(anonymous_namespace)::BBs;
    (anonymous_namespace)::Builder = pIVar14;
    (pIVar14->super_IRBuilderBase).BB = pBVar18;
    (pIVar14->super_IRBuilderBase).InsertPt.NodePtr = (node_pointer)(pBVar18 + 0x28);
    pFVar36 = (anonymous_namespace)::F;
    if ((anonymous_namespace)::ArgsFromMem[0x80] == '\x01') {
      if ((undefined1  [8])
          ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
          super__Vector_impl_data._M_start != auStack_148) {
        uVar34 = 1;
        pFVar36 = (Function *)0x0;
        do {
          pIVar14 = (anonymous_namespace)::Builder;
          if (((Function *)
               ((long)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)auStack_b8 >> 3) <= pFVar36)
             || ((Function *)(DAT_0092f060 - (anonymous_namespace)::globs >> 3) <= pFVar36)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pFVar36);
            goto LAB_0025ff95;
          }
          pTVar17 = *(Type **)((long)(Child *)auStack_b8 + (long)pFVar36 * 8);
          pVVar16 = *(Value **)((anonymous_namespace)::globs + (long)pFVar36 * 8);
          llvm::Twine::Twine((Twine *)local_2f8,"");
          a = llvm::IRBuilderBase::CreateAlignedLoad
                        (&pIVar14->super_IRBuilderBase,pTVar17,pVVar16,(MaybeAlign)0x0,false,
                         (Twine *)local_2f8);
          if ((Function *)
              ((long)ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)auStack_148 >> 3) <= pFVar36)
          goto LAB_0025ffc1;
          auVar48 = llvm::Type::getPrimitiveSizeInBits(*(pointer)((long)auStack_148 + pFVar36 * 8));
          local_2f8 = auVar48._0_8_;
          VMap.Map.Buckets =
               (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
                *)CONCAT44(VMap.Map.Buckets._4_4_,auVar48._8_4_);
          uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f8);
          anon_unknown.dwarf_23d32::addArg((Value *)a,(int)uVar15,ArgsTy_00);
          pFVar36 = (Function *)(ulong)uVar34;
          uVar34 = uVar34 + 1;
        } while (pFVar36 < (Function *)
                           ((long)ArgsTy.
                                  super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_148 >> 3)
                );
      }
LAB_0025efd8:
      iVar9 = 1;
      if ((anonymous_namespace)::Geni1[0x80] == '\0') {
        iVar9 = (anonymous_namespace)::W._128_4_;
      }
      pVVar16 = anon_unknown.dwarf_23d32::genVal((int *)local_50,iVar9,false,false);
      auVar48 = llvm::Type::getPrimitiveSizeInBits(*(Type **)pVVar16);
      local_2f8 = auVar48._0_8_;
      VMap.Map.Buckets =
           (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
            *)CONCAT44(VMap.Map.Buckets._4_4_,auVar48._8_4_);
      uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f8);
      pIVar14 = (anonymous_namespace)::Builder;
      if (uVar15 < uVar32) {
        pTVar17 = (Type *)llvm::Type::getIntNTy
                                    ((LLVMContext *)&(anonymous_namespace)::C,
                                     (anonymous_namespace)::Promote._128_4_);
        llvm::Twine::Twine((Twine *)local_2f8,"");
        pVVar16 = llvm::IRBuilderBase::CreateCast
                            (&pIVar14->super_IRBuilderBase,ZExt,pVVar16,pTVar17,(Twine *)local_2f8);
      }
      pIVar14 = (anonymous_namespace)::Builder;
      llvm::IRBuilderBase::CreateRet(&(anonymous_namespace)::Builder->super_IRBuilderBase,pVVar16);
      puVar5 = DAT_0092f048;
      for (puVar26 = (anonymous_namespace)::Branches; puVar26 != puVar5; puVar26 = puVar26 + 1) {
        pBVar18 = anon_unknown.dwarf_23d32::chooseTarget((BasicBlock *)pIVar14);
        pIVar14 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)*puVar26;
        llvm::BranchInst::setSuccessor((BranchInst *)pIVar14,0,pBVar18);
        this_00 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)*puVar26;
        if ((*(uint *)((this_00->super_IRBuilderBase).MetadataToCopy.
                       super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>.
                       InlineElts + 4) & 0x7ffffff) == 3) {
          pBVar18 = anon_unknown.dwarf_23d32::chooseTarget((BasicBlock *)pIVar14);
          llvm::BranchInst::setSuccessor((BranchInst *)this_00,1,pBVar18);
          pIVar14 = this_00;
        }
      }
LAB_0025f0db:
      pFVar36 = *(Function **)((anonymous_namespace)::F + 0x50);
      uVar28 = (anonymous_namespace)::F + 0x48;
      bVar43 = pFVar36 == (Function *)uVar28;
      uVar8 = uVar28;
      if (!bVar43) {
        do {
          SStr.field_2._8_8_ = uVar8;
          pFVar40 = pFVar36 + -0x18;
          if (pFVar36 == (Function *)0x0) {
            pFVar40 = (Function *)0x0;
          }
          pFVar37 = *(Function **)(pFVar40 + 0x30);
          pFVar40 = pFVar40 + 0x28;
          if (pFVar37 != pFVar40) {
            pFVar20 = pFVar37 + -0x18;
            if (pFVar37 == (Function *)0x0) {
              pFVar20 = (Function *)0x0;
            }
            bVar44 = pFVar20[0x10] != (Function)0x52;
            do {
              while( true ) {
                pFVar37 = *(Function **)(pFVar37 + 8);
                if (pFVar37 == pFVar40) goto LAB_0025f192;
                pFVar20 = pFVar37 + -0x18;
                if (pFVar37 == (Function *)0x0) {
                  pFVar20 = (Function *)0x0;
                }
                if (pFVar20[0x10] == (Function)0x52) break;
                bVar44 = true;
              }
            } while (!bVar44);
            pBVar18 = *(BasicBlock **)(pFVar20 + 0x28);
            llvm::Twine::Twine((Twine *)local_2f8,"phisp");
            llvm::BasicBlock::splitBasicBlock(pBVar18,pFVar20 + 0x18,(Twine *)local_2f8,0);
            uVar28 = SStr.field_2._8_8_;
            if (pFVar37 != pFVar40) goto LAB_0025f1a4;
          }
LAB_0025f192:
          pFVar36 = *(Function **)(pFVar36 + 8);
          bVar43 = pFVar36 == (Function *)uVar28;
          uVar8 = SStr.field_2._8_8_;
          if (bVar43) break;
        } while( true );
      }
      goto LAB_0025f1ac;
    }
    if (((byte)(anonymous_namespace)::F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments((anonymous_namespace)::F);
    }
    pVVar16 = *(Value **)(pFVar36 + 0x58);
    uVar15 = 0;
    while( true ) {
      pFVar36 = (anonymous_namespace)::F;
      if (((byte)(anonymous_namespace)::F[0x12] & 1) != 0) {
        llvm::Function::BuildLazyArguments((anonymous_namespace)::F);
      }
      if (pVVar16 == (Value *)(*(long *)(pFVar36 + 0x60) * 0x28 + *(long *)(pFVar36 + 0x58)))
      goto LAB_0025efd8;
      if ((ulong)((long)ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)auStack_148 >> 3) <= uVar15
         ) break;
      auVar48 = llvm::Type::getPrimitiveSizeInBits(*(pointer)((long)auStack_148 + uVar15 * 8));
      local_2f8 = auVar48._0_8_;
      VMap.Map.Buckets =
           (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
            *)CONCAT44(VMap.Map.Buckets._4_4_,auVar48._8_4_);
      uVar19 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f8);
      anon_unknown.dwarf_23d32::addArg(pVVar16,(int)uVar19,ArgsTy_01);
      uVar15 = (ulong)((int)uVar15 + 1);
      pVVar16 = pVVar16 + 0x28;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0025ffc1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pFVar36);
  }
  pcVar39 = "Width must be >= 2";
LAB_0026000f:
  anon_unknown.dwarf_23d32::die(pcVar39);
LAB_0025f1a4:
  if (bVar43) goto LAB_0025f1ac;
  goto LAB_0025f0db;
LAB_0025ff95:
  pcVar39 = 
  "static bool llvm::isa_impl_cl<llvm::PHINode, const llvm::Instruction *>::doit(const From *) [To = llvm::PHINode, From = const llvm::Instruction *]"
  ;
  goto LAB_0025ff43;
LAB_0025f1ac:
  pFVar36 = *(Function **)((anonymous_namespace)::F + 0x50);
  pFVar40 = (anonymous_namespace)::F + 0x48;
  if (pFVar36 == pFVar40) {
    pFVar37 = (Function *)0x0;
  }
  else {
    do {
      pFVar20 = pFVar36 + -0x18;
      if (pFVar36 == (Function *)0x0) {
        pFVar20 = (Function *)0x0;
      }
      pFVar37 = *(Function **)(pFVar20 + 0x30);
    } while ((pFVar37 == pFVar20 + 0x28) &&
            (pFVar36 = *(Function **)(pFVar36 + 8), pFVar36 != pFVar40));
  }
joined_r0x0025f29d:
  if (pFVar36 != pFVar40) {
    if (pFVar37 == (Function *)0x0) goto LAB_0025ff95;
    if (pFVar37[-8] == (Function)0x52) {
      lVar35 = *(long *)(pFVar37 + 0x10);
      llvm::Value::assertModuleIsMaterializedImpl();
      for (lVar35 = *(long *)(lVar35 + 8); lVar35 != 0; lVar35 = *(long *)(lVar35 + 8)) {
        if (*(long *)(lVar35 + 0x18) == 0) goto LAB_0025ff2e;
        bVar4 = *(byte *)(*(long *)(lVar35 + 0x18) + 0x10);
        if (0x1a < bVar4 && bVar4 - 0x1c < 0xb) break;
      }
LAB_0025f3a4:
      if (lVar35 != 0) {
        lVar41 = *(long *)(lVar35 + 0x18);
        if (lVar41 == 0) goto LAB_0025ff2e;
        if (*(byte *)(lVar41 + 0x10) < 0x1b) {
          __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                        "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x10d,
                        "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = llvm::Instruction, Y = llvm::User]"
                       );
        }
        if (local_50._0_4_ != 0) {
          anon_unknown.dwarf_23d32::die("Budget == 0 failed at line __LINE__");
        }
        pBVar18 = *(BasicBlock **)(lVar41 + 0x28);
        auVar48 = llvm::Type::getPrimitiveSizeInBits(*(Type **)(pFVar37 + -0x18));
        local_2f8 = auVar48._0_8_;
        VMap.Map.Buckets =
             (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
              *)CONCAT44(VMap.Map.Buckets._4_4_,auVar48._8_4_);
        uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f8);
        pVVar16 = anon_unknown.dwarf_23d32::genVal((int *)local_50,(int)uVar15,true,false);
        llvm::PHINode::addIncoming((PHINode *)(pFVar37 + -0x18),pVVar16,pBVar18);
        do {
          lVar35 = *(long *)(lVar35 + 8);
          if (lVar35 == 0) break;
          if (*(long *)(lVar35 + 0x18) == 0) goto LAB_0025ff2e;
          bVar4 = *(byte *)(*(long *)(lVar35 + 0x18) + 0x10);
        } while (bVar4 < 0x1b || 10 < bVar4 - 0x1c);
        goto LAB_0025f3a4;
      }
    }
    pFVar37 = *(Function **)(pFVar37 + 8);
    pFVar20 = pFVar36 + -0x18;
    if (pFVar36 == (Function *)0x0) {
      pFVar20 = (Function *)0x0;
    }
    if (pFVar37 == pFVar20 + 0x28) {
      for (pFVar36 = *(Function **)(pFVar36 + 8); pFVar36 != pFVar40;
          pFVar36 = *(Function **)(pFVar36 + 8)) {
        pFVar20 = pFVar36 + -0x18;
        if (pFVar36 == (Function *)0x0) {
          pFVar20 = (Function *)0x0;
        }
        pFVar37 = *(Function **)(pFVar20 + 0x30);
        if (pFVar37 != pFVar20 + 0x28) break;
      }
    }
    goto joined_r0x0025f29d;
  }
  pFVar36 = *(Function **)((anonymous_namespace)::F + 0x50);
  pFVar40 = (anonymous_namespace)::F + 0x48;
  if (pFVar36 != pFVar40) {
    bVar43 = true;
    do {
      pFVar37 = pFVar36 + -0x18;
      if (pFVar36 == (Function *)0x0) {
        pFVar37 = (Function *)0x0;
      }
      if (bVar43) {
        bVar43 = false;
      }
      else {
        llvm::Value::assertModuleIsMaterializedImpl();
        for (lVar35 = *(long *)(pFVar37 + 8); lVar35 != 0; lVar35 = *(long *)(lVar35 + 8)) {
          if (*(long *)(lVar35 + 0x18) == 0) goto LAB_0025ff2e;
          bVar4 = *(byte *)(*(long *)(lVar35 + 0x18) + 0x10);
          if (0x1a < bVar4 && bVar4 - 0x1c < 0xb) break;
        }
        lVar41 = lVar35;
        if (lVar35 == 0) {
LAB_0025ffac:
          exit(0);
        }
LAB_0025f47c:
        do {
          lVar41 = *(long *)(lVar41 + 8);
          if (lVar41 != 0) {
            if (*(long *)(lVar41 + 0x18) == 0) goto LAB_0025ff2e;
            bVar4 = *(byte *)(*(long *)(lVar41 + 0x18) + 0x10);
            if (bVar4 < 0x1b || 10 < bVar4 - 0x1c) goto LAB_0025f47c;
          }
        } while (lVar41 != 0);
        if (lVar35 == 0) goto LAB_0025ffac;
      }
      pFVar36 = *(Function **)(pFVar36 + 8);
    } while (pFVar36 != pFVar40);
  }
  if (auStack_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_b8,
                    (long)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_b8);
  }
  if (auStack_148 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_148,
                    (long)ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_148);
  }
  local_170 = (undefined1  [8])&SStr._M_string_length;
  SStr._M_dataplus._M_p = (pointer)0x0;
  SStr._M_string_length._0_1_ = 0;
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)auStack_148,(string *)local_170);
  llvm::legacy::PassManager::PassManager((PassManager *)p);
  if ((anonymous_namespace)::RemoveUnusedArgs[0x80] == '\x01') {
    pppFStack_78 = (pointer *)0x0;
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar12 = *(Module **)((anonymous_namespace)::M + 0x20);
    pMVar42 = (anonymous_namespace)::M + 0x18;
    if (pMVar12 != pMVar42) {
      do {
        pTVar21 = (Twine *)(pMVar12 + -0x38);
        if (pMVar12 == (Module *)0x0) {
          pTVar21 = (Twine *)0x0;
        }
        if ((pTVar21[2].RHS.twine != (Twine *)0x0) && ((pTVar21->RHSKind & 0x20) == NullKind)) {
          local_2f8 = (undefined1  [8])pTVar21;
          std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
          emplace_back<llvm::Function*>
                    ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)&pppFStack_78,
                     (Function **)local_2f8);
        }
        pMVar12 = *(Module **)(pMVar12 + 8);
      } while (pMVar12 != pMVar42);
    }
    ppFVar6 = Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pointer)pppFStack_78 !=
        Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ppFVar29 = (pointer)pppFStack_78;
      do {
        pFVar36 = *ppFVar29;
        VMap.Map.NumEntries = 0x80;
        local_2f8 = (undefined1  [8])llvm::allocate_buffer(0x2000,8);
        llvm::
        DenseMapBase<llvm::DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>,_llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
        ::initEmpty((DenseMapBase<llvm::DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>,_llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
                     *)local_2f8);
        VMap.Map.NumBuckets._0_1_ = 0;
        VMap.MDMap.Storage.field_0.field2[0x10] = 0;
        auStack_f8 = (undefined1  [8])0x0;
        InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        iVar46 = llvm::Function::args(pFVar36);
        for (pTVar21 = (Twine *)iVar46.begin_iterator; pTVar21 != (Twine *)iVar46.end_iterator;
            pTVar21 = pTVar21 + 1) {
          iVar9 = llvm::Value::getNumUses((Value *)pTVar21);
          if (iVar9 == 0) {
            pVVar16 = (Value *)llvm::UndefValue::get((Type *)(pTVar21->LHS).twine);
            auStack_b8 = (undefined1  [8])pTVar21;
            this = &llvm::
                    ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                    ::operator[]((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                                  *)local_2f8,(Value **)auStack_b8)->super_ValueHandleBase;
            llvm::ValueHandleBase::operator=(this,pVVar16);
          }
        }
        if ((int)VMap.Map.Buckets != 0) {
          pFVar40 = (Function *)
                    llvm::CloneFunction(pFVar36,(ValueMap *)local_2f8,(ClonedCodeInfo *)0x0);
          llvm::Function::removeFromParent(pFVar40);
          llvm::
          iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
          ::insertAfter((iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
                         *)((anonymous_namespace)::M + 0x18),(node_pointer)(pFVar36 + 0x38),pFVar40)
          ;
          auVar47 = llvm::Value::getName((Value *)pFVar36);
          local_50 = (undefined1  [8])&local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,auVar47._0_8_,auVar47._8_8_ + auVar47._0_8_);
          llvm::Function::eraseFromParent();
          llvm::Twine::Twine((Twine *)auStack_b8,(string *)local_50);
          llvm::Value::setName((Value *)pFVar40,(Twine *)auStack_b8);
          if (local_50 != (undefined1  [8])&local_40) {
            operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
          }
        }
        std::vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>::~vector
                  ((vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> *)auStack_f8);
        if (VMap.MDMap.Storage.field_0.field2[0x10] == '\x01') {
          llvm::
          DenseMap<const_llvm::Metadata_*,_llvm::TrackingMDRef,_llvm::DenseMapInfo<const_llvm::Metadata_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Metadata_*,_llvm::TrackingMDRef>_>
          ::~DenseMap((DenseMap<const_llvm::Metadata_*,_llvm::TrackingMDRef,_llvm::DenseMapInfo<const_llvm::Metadata_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Metadata_*,_llvm::TrackingMDRef>_>
                       *)&VMap.Map.NumBuckets);
          VMap.MDMap.Storage.field_0.field2[0x10] = 0;
        }
        llvm::
        DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
        ::~DenseMap((DenseMap<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH,_llvm::DenseMapInfo<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_void>,_llvm::detail::DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>_>
                     *)local_2f8);
        ppFVar29 = ppFVar29 + 1;
      } while (ppFVar29 != ppFVar6);
    }
    if ((pointer)pppFStack_78 != (pointer)0x0) {
      operator_delete(pppFStack_78,
                      (long)Funcs.
                            super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pppFStack_78);
    }
  }
  if ((anonymous_namespace)::Verify[0x80] == '\x01') {
    pPVar22 = (Pass *)llvm::createVerifierPass(true);
    llvm::legacy::PassManager::add((PassManager *)p,pPVar22);
  }
  puVar2 = &VMap.Map.NumEntries;
  VMap.Map.Buckets =
       (DenseMapPair<llvm::ValueMapCallbackVH<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>,_llvm::WeakTrackingVH>
        *)0x0;
  VMap.Map.NumEntries = VMap.Map.NumEntries & 0xffffff00;
  local_2f8 = (undefined1  [8])puVar2;
  pPVar22 = (Pass *)llvm::createPrintModulePass
                              ((raw_ostream *)auStack_148,(string *)local_2f8,false);
  llvm::legacy::PassManager::add((PassManager *)p,pPVar22);
  if (local_2f8 != (undefined1  [8])puVar2) {
    operator_delete((void *)local_2f8,CONCAT44(VMap.Map.NumTombstones,VMap.Map.NumEntries) + 1);
  }
  llvm::legacy::PassManager::run((PassManager *)p,(anonymous_namespace)::M);
  auStack_b8 = (undefined1  [8])
               &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_b8,*local_108,local_108[1] + *local_108);
  if ((anonymous_namespace)::OneFuncPerFile[0x80] == '\x01') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
    poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&VMap.Map.NumEntries,
                         (char *)(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,
                         (anonymous_namespace)::BaseName_abi_cxx11_._136_8_);
    uVar15 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar15 = (anonymous_namespace)::Id;
    }
    uVar34 = 1;
    if (9 < uVar15) {
      uVar19 = uVar15;
      uVar32 = 4;
      do {
        uVar34 = uVar32;
        if (uVar19 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_0025f96f;
        }
        if (uVar19 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_0025f96f;
        }
        if (uVar19 < 10000) goto LAB_0025f96f;
        bVar43 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar32 = uVar34 + 4;
      } while (bVar43);
      uVar34 = uVar34 + 1;
    }
LAB_0025f96f:
    lVar35 = (long)(anonymous_namespace)::Id >> 0x3f;
    local_50 = (undefined1  [8])&local_40;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)uVar34 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_50 + -lVar35),uVar34,uVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)local_50,_Budget);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    uVar15 = std::__cxx11::string::find
                       (auStack_b8,(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,0);
    std::__cxx11::string::replace
              ((ulong)auStack_b8,uVar15,(char *)(anonymous_namespace)::BaseName_abi_cxx11_._136_8_,
               0x7769e9);
    uVar15 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar15 = (anonymous_namespace)::Id;
    }
    uVar34 = 1;
    if (9 < uVar15) {
      uVar19 = uVar15;
      uVar32 = 4;
      do {
        uVar34 = uVar32;
        if (uVar19 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_0025fbbf;
        }
        if (uVar19 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_0025fbbf;
        }
        if (uVar19 < 10000) goto LAB_0025fbbf;
        bVar43 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar32 = uVar34 + 4;
      } while (bVar43);
      uVar34 = uVar34 + 1;
    }
LAB_0025fbbf:
    lVar35 = (long)(anonymous_namespace)::Id >> 0x3f;
    ppWVar3 = &InstToDelete.super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>._M_impl.
               super__Vector_impl_data._M_finish;
    auStack_f8 = (undefined1  [8])ppWVar3;
    std::__cxx11::string::_M_construct
              ((ulong)auStack_f8,(char)uVar34 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)auStack_f8 + -lVar35),uVar34,uVar15);
    plVar24 = (long *)std::__cxx11::string::replace
                                ((ulong)auStack_f8,0,(char *)0x0,
                                 (anonymous_namespace)::BaseName_abi_cxx11_._128_8_);
    pppFVar1 = &Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    plVar30 = plVar24 + 2;
    if ((pointer *)*plVar24 == (pointer *)plVar30) {
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)*plVar30;
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)plVar24[3];
      pppFStack_78 = pppFVar1;
    }
    else {
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)*plVar30;
      pppFStack_78 = (pointer *)*plVar24;
    }
    Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar24[1];
    *plVar24 = (long)plVar30;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    plVar24 = (long *)std::__cxx11::string::append((char *)&pppFStack_78);
    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar24 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar24 == paVar31) {
      local_40._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_40._8_8_ = plVar24[3];
      local_50 = (undefined1  [8])&local_40;
    }
    else {
      local_40._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_50 = (undefined1  [8])*plVar24;
    }
    _Budget = plVar24[1];
    *plVar24 = (long)paVar31;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    if (pppFStack_78 != pppFVar1) {
      operator_delete(pppFStack_78,
                      (long)Funcs.
                            super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1);
    }
    if (auStack_f8 != (undefined1  [8])ppWVar3) {
      operator_delete((void *)auStack_f8,
                      (ulong)(InstToDelete.
                              super__Vector_base<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1));
    }
    iVar9 = open((char *)local_50,0xc2,0x180);
    if (local_50 == (undefined1  [8])&local_40) goto LAB_0025fd0b;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
    poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&VMap.Map.NumEntries,
                         (char *)(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,
                         (anonymous_namespace)::BaseName_abi_cxx11_._136_8_);
    uVar15 = -(anonymous_namespace)::Id;
    if (0 < (long)(anonymous_namespace)::Id) {
      uVar15 = (anonymous_namespace)::Id;
    }
    uVar34 = 1;
    if (9 < uVar15) {
      uVar19 = uVar15;
      uVar32 = 4;
      do {
        uVar34 = uVar32;
        if (uVar19 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_0025fa89;
        }
        if (uVar19 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_0025fa89;
        }
        if (uVar19 < 10000) goto LAB_0025fa89;
        bVar43 = 99999 < uVar19;
        uVar19 = uVar19 / 10000;
        uVar32 = uVar34 + 4;
      } while (bVar43);
      uVar34 = uVar34 + 1;
    }
LAB_0025fa89:
    lVar35 = (long)(anonymous_namespace)::Id >> 0x3f;
    local_50 = (undefined1  [8])&local_40;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)uVar34 - (char)((long)(anonymous_namespace)::Id >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_50 + -lVar35),uVar34,uVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)local_50,_Budget);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    uVar15 = std::__cxx11::string::find
                       (auStack_b8,(anonymous_namespace)::BaseName_abi_cxx11_._128_8_,0);
    uVar28 = (anonymous_namespace)::BaseName_abi_cxx11_._136_8_;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)auStack_b8,uVar15,(char *)uVar28,(ulong)local_50);
    if (local_50 != (undefined1  [8])&local_40) {
      operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
    }
    iVar9 = rand();
    uVar32 = (uint)((long)iVar9 % (long)(int)(anonymous_namespace)::NumFiles._128_4_);
    uVar34 = -uVar32;
    if (0 < (int)uVar32) {
      uVar34 = uVar32;
    }
    __len = 1;
    if (9 < uVar34) {
      uVar15 = (ulong)uVar34;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar27 = (uint)uVar15;
        if (uVar27 < 100) {
          __len = __len - 2;
          goto LAB_0025fe6b;
        }
        if (uVar27 < 1000) {
          __len = __len - 1;
          goto LAB_0025fe6b;
        }
        if (uVar27 < 10000) goto LAB_0025fe6b;
        uVar15 = uVar15 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar27);
      __len = __len + 1;
    }
LAB_0025fe6b:
    pppFVar1 = &Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    pppFStack_78 = pppFVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&pppFStack_78,
               (char)__len -
               ((char)((ulong)((long)iVar9 % (long)(int)(anonymous_namespace)::NumFiles._128_4_) >>
                      0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar32 >> 0x1f) + (long)pppFStack_78),__len,uVar34);
    puVar26 = (undefined8 *)std::__cxx11::string::append((char *)&pppFStack_78);
    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar26 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar26 == paVar31) {
      local_40._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_40._8_8_ = puVar26[3];
      local_50 = (undefined1  [8])&local_40;
    }
    else {
      local_40._M_allocated_capacity = paVar31->_M_allocated_capacity;
      local_50 = (undefined1  [8])*puVar26;
    }
    _Budget = puVar26[1];
    *puVar26 = paVar31;
    puVar26[1] = 0;
    *(undefined1 *)(puVar26 + 2) = 0;
    if (pppFStack_78 != pppFVar1) {
      operator_delete(pppFStack_78,
                      (long)Funcs.
                            super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1);
    }
    iVar9 = open((char *)local_50,0x442,0x180);
    if (local_50 == (undefined1  [8])&local_40) goto LAB_0025fd0b;
  }
  operator_delete((void *)local_50,local_40._M_allocated_capacity + 1);
LAB_0025fd0b:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
  std::ios_base::~ios_base(local_278);
  if (iVar9 < 2) {
    anon_unknown.dwarf_23d32::die("open failed");
  }
  uVar15 = write(iVar9,(void *)auStack_b8,
                 (size_t)RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if ((pointer)(uVar15 & 0xffffffff) ==
      RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar9 = close(iVar9);
    if (iVar9 == 0) {
      if (auStack_b8 !=
          (undefined1  [8])
          &RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)auStack_b8,
                        (long)RealArgsTy.
                              super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 1);
      }
      llvm::legacy::PassManager::~PassManager((PassManager *)p);
      llvm::raw_ostream::~raw_ostream((raw_ostream *)auStack_148);
      if (local_170 != (undefined1  [8])&SStr._M_string_length) {
        operator_delete((void *)local_170,
                        CONCAT71(SStr._M_string_length._1_7_,(undefined1)SStr._M_string_length) + 1)
        ;
      }
      _Var11 = getpid();
      if (_Var11 == _Var10) {
        close(local_cc);
        read(local_d0,local_2f8,1);
        lVar35 = 0;
        do {
          if (*(int *)((long)(anonymous_namespace)::Shmem + lVar35 * 4 + 0x12f8) != 0) {
            prVar25 = (raw_ostream *)llvm::errs();
            Str.Length = 0x25;
            Str.Data = "oops, there are waiting processes at ";
            prVar25 = llvm::raw_ostream::operator<<(prVar25,Str);
            prVar25 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar25,lVar35);
            Str_00.Length = 1;
            Str_00.Data = "\n";
            llvm::raw_ostream::operator<<(prVar25,Str_00);
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 != 100);
      }
      llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry((PrettyStackTraceEntry *)local_318);
      return 0;
    }
    pcVar39 = "res == 0 failed at line __LINE__";
  }
  else {
    pcVar39 = "non-atomic write";
  }
  anon_unknown.dwarf_23d32::die(pcVar39);
LAB_0025ff2e:
  pcVar39 = 
  "static bool llvm::isa_impl_cl<llvm::Instruction, const llvm::User *>::doit(const From *) [To = llvm::Instruction, From = const llvm::User *]"
  ;
LAB_0025ff43:
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,pcVar39);
}

Assistant:

int main(int argc, char **argv) {
  PrettyStackTraceProgram X(argc, argv);
  cl::ParseCommandLineOptions(argc, argv, "llvm codegen stress-tester\n");

  if (W < 2)
    die("Width must be >= 2");

  Shmem =
      (struct shared *)::mmap(0, sizeof(struct shared), PROT_READ | PROT_WRITE,
                              MAP_SHARED | MAP_ANON, -1, 0);
  if (Shmem == MAP_FAILED)
    die("mmap failed");
  Shmem->NextId = 1;
  Shmem->Running = 1;
  if (pthread_mutexattr_init(&Shmem->LockAttr) != 0)
    die("pthread_mutexattr_init failed");
  if (pthread_mutexattr_setpshared(&Shmem->LockAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_mutexattr_setpshared failed");
  if (pthread_mutex_init(&Shmem->Lock, &Shmem->LockAttr) != 0)
    die("pthread_mutex_init failed");
  if (pthread_condattr_init(&Shmem->CondAttr) != 0)
    die("pthread_condattr_init failed");
  if (pthread_condattr_setpshared(&Shmem->CondAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_condattr_setpshared failed");
  for (int i = 0; i < MAX_DEPTH; ++i) {
    if (pthread_cond_init(&Shmem->Cond[i], &Shmem->CondAttr) != 0)
      die("pthread_cond_init failed");
    Shmem->Waiting[i] = 0;
  }
  Init = 1;

  int p[2];
  pid_t original_pid = ::getpid();
  if (::atexit(decrease_runners) != 0)
    die("atexit failed");
  /*
   * use a trick from stackoverflow to work around the fact that in
   * UNIX we can only wait on our children, not our extended
   * descendents: all descendents are going to inherit this pipe,
   * implicitly closing its fds when they terminate. at that point
   * reading from the pipe will not block but rather return with EOF
   */
  if (::pipe(p) != 0)
    die("pipe failed??");

  generate();
  output();

  if (::getpid() == original_pid) {
    char buf[1];
    ::close(p[1]);
    ::read(p[0], buf, 1);
    for (int i = 0; i < MAX_DEPTH; i++) {
      if (Shmem->Waiting[i] != 0)
        errs() << "oops, there are waiting processes at " << i << "\n";
    }
  }

  return 0;
}